

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLoop4(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  FeatureType *pFVar2;
  ArrayFeatureType *this_00;
  GreaterThanLayerParams *this_01;
  ActivationParams *this_02;
  NeuralNetwork *pNVar3;
  ostream *poVar4;
  Result local_170;
  NeuralNetworkLayer *l4;
  LoopLayerParams *loop_params;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l2;
  NeuralNetwork nnBody;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnCondition;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnCondition._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nnCondition._80_8_,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnCondition._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  nnBody._80_8_ = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_greaterthan
                      ((NeuralNetworkLayer *)nnBody._80_8_);
  CoreML::Specification::GreaterThanLayerParams::set_alpha(this_01,1.0);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)nnBody._80_8_,"cond2");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)nnBody._80_8_,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)nnBody._80_8_,"cond2")
  ;
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l2);
  nnMain = (NeuralNetwork *)CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l2);
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_activation
                      ((NeuralNetworkLayer *)nnMain);
  CoreML::Specification::ActivationParams::mutable_relu(this_02);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)nnMain,"relu");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)nnMain,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)nnMain,"B");
  l3 = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)l3,EXACT_ARRAY_MAPPING);
  loop_params = (LoopLayerParams *)
                CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l3);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)loop_params,"for_loop");
  l4 = (NeuralNetworkLayer *)
       CoreML::Specification::NeuralNetworkLayer::mutable_loop((NeuralNetworkLayer *)loop_params);
  pNVar3 = CoreML::Specification::LoopLayerParams::mutable_bodynetwork((LoopLayerParams *)l4);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar3,(NeuralNetwork *)&l2);
  pNVar3 = CoreML::Specification::LoopLayerParams::mutable_conditionnetwork((LoopLayerParams *)l4);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar3,(NeuralNetwork *)&l1);
  CoreML::Specification::LoopLayerParams::set_conditionvar((LoopLayerParams *)l4,"cond");
  local_170.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l3);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)local_170.m_message._M_storage._M_storage,"copy");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)local_170.m_message._M_storage._M_storage,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)local_170.m_message._M_storage._M_storage,"B");
  CoreML::Specification::NeuralNetworkLayer::mutable_copy
            ((NeuralNetworkLayer *)local_170.m_message._M_storage._M_storage);
  CoreML::validate<(MLModelType)500>(&local_170,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_170);
  if (m._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x123a);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_170);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l2);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLoop4() {
    /*
     condition network present, condition variable present, but condition var not in condition network
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    Specification::NeuralNetwork nnCondition;
    auto *l1 = nnCondition.add_layers();
    l1->mutable_greaterthan()->set_alpha(1.0);
    l1->set_name("cond2");
    l1->add_input("A");
    l1->add_output("cond2");
    
    Specification::NeuralNetwork nnBody;
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");
    
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->mutable_conditionnetwork()->CopyFrom(nnCondition);
    loop_params->set_conditionvar("cond");
    
    auto *l4 = nnMain->add_layers();
    l4->set_name("copy");
    l4->add_input("A");
    l4->add_output("B");
    (void) l4->mutable_copy();
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}